

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void VP8IteratorExport(VP8EncIterator *it)

{
  int iVar1;
  WebPPicture *pWVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint8_t *puVar7;
  int iVar8;
  uint8_t *__dest;
  size_t __n;
  uint uVar9;
  uint8_t *__dest_00;
  uint8_t *__dest_01;
  
  if (it->enc_->config_->show_compressed != 0) {
    iVar6 = it->x_;
    iVar1 = it->y_;
    puVar3 = it->yuv_out_;
    pWVar2 = it->enc_->pic_;
    iVar4 = (pWVar2->uv_stride * iVar1 + iVar6) * 8;
    __dest_01 = pWVar2->u + iVar4;
    __dest_00 = pWVar2->v + iVar4;
    iVar8 = pWVar2->width + iVar6 * -0x10;
    iVar4 = pWVar2->height + iVar1 * -0x10;
    if (0xf < iVar8) {
      iVar8 = 0x10;
    }
    iVar5 = 0x10;
    if (iVar4 < 0x10) {
      iVar5 = iVar4;
    }
    if (0 < iVar4) {
      iVar4 = pWVar2->y_stride;
      __dest = pWVar2->y + (iVar1 * iVar4 + iVar6) * 0x10;
      uVar9 = iVar5 + 1;
      puVar7 = puVar3;
      do {
        memcpy(__dest,puVar7,(long)iVar8);
        __dest = __dest + iVar4;
        puVar7 = puVar7 + 0x20;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
    iVar6 = iVar5 + 1 >> 1;
    if (0 < iVar6) {
      puVar7 = puVar3 + 0x10;
      puVar3 = puVar3 + 0x18;
      iVar1 = pWVar2->uv_stride;
      __n = (size_t)(iVar8 + 1 >> 1);
      uVar9 = iVar6 + 1;
      do {
        memcpy(__dest_01,puVar7,__n);
        __dest_01 = __dest_01 + iVar1;
        puVar7 = puVar7 + 0x20;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
      iVar1 = pWVar2->uv_stride;
      uVar9 = iVar6 + 1;
      do {
        memcpy(__dest_00,puVar3,__n);
        __dest_00 = __dest_00 + iVar1;
        puVar3 = puVar3 + 0x20;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
    }
  }
  return;
}

Assistant:

void VP8IteratorExport(const VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc_;
  if (enc->config_->show_compressed) {
    const int x = it->x_, y = it->y_;
    const uint8_t* const ysrc = it->yuv_out_ + Y_OFF_ENC;
    const uint8_t* const usrc = it->yuv_out_ + U_OFF_ENC;
    const uint8_t* const vsrc = it->yuv_out_ + V_OFF_ENC;
    const WebPPicture* const pic = enc->pic_;
    uint8_t* const ydst = pic->y + (y * pic->y_stride + x) * 16;
    uint8_t* const udst = pic->u + (y * pic->uv_stride + x) * 8;
    uint8_t* const vdst = pic->v + (y * pic->uv_stride + x) * 8;
    int w = (pic->width - x * 16);
    int h = (pic->height - y * 16);

    if (w > 16) w = 16;
    if (h > 16) h = 16;

    // Luma plane
    ExportBlock(ysrc, ydst, pic->y_stride, w, h);

    {   // U/V planes
      const int uv_w = (w + 1) >> 1;
      const int uv_h = (h + 1) >> 1;
      ExportBlock(usrc, udst, pic->uv_stride, uv_w, uv_h);
      ExportBlock(vsrc, vdst, pic->uv_stride, uv_w, uv_h);
    }
  }
}